

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

double __thiscall gmath::OrthoCamera::projectPoint(OrthoCamera *this,Vector2d *p,Vector3d *Pw)

{
  Vector3d Pc;
  SVector<double,_3> local_a0;
  SVector<double,_3> local_88;
  SMatrix<double,_3,_3> local_70;
  
  transpose<double,3,3>(&local_70,(gmath *)&(this->super_Camera).R,(SMatrix<double,_3,_3> *)Pw);
  SVector<double,_3>::operator-(&local_a0,Pw,&(this->super_Camera).T);
  SMatrix<double,_3,_3>::operator*(&local_88,&local_70,&local_a0);
  p->v[0] = local_88.v[0] / this->res;
  p->v[1] = -local_88.v[1] / this->res;
  return local_88.v[2] / this->dres;
}

Assistant:

double OrthoCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  Vector3d Pc=transpose(getR())*(Pw-getT());

  p[0]=Pc[0]/res;
  p[1]=-Pc[1]/res;

  return Pc[2]/dres;
}